

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

int __thiscall tetgenmesh::checkshells(tetgenmesh *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  memorypool *pmVar4;
  void **ppvVar5;
  void **ppvVar6;
  void *pvVar7;
  long lVar8;
  ulong uVar9;
  void *pvVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  char *__s;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  void *pvVar19;
  uint uVar20;
  void *pvVar21;
  void *pvVar22;
  uint local_94;
  
  if (this->b->quiet == 0) {
    puts("  Checking consistency of the mesh boundary...");
  }
  pmVar4 = this->subfaces;
  ppvVar5 = pmVar4->firstblock;
  ppvVar6 = pmVar4->pathblock;
  pvVar7 = pmVar4->pathitem;
  iVar1 = pmVar4->pathitemsleft;
  iVar2 = pmVar4->alignbytes;
  pmVar4->pathblock = ppvVar5;
  pmVar4->pathitem =
       (void *)((long)ppvVar5 + (((long)iVar2 + 8U) - (ulong)(ppvVar5 + 1) % (ulong)(long)iVar2));
  pmVar4->pathitemsleft = pmVar4->itemsperblock;
  do {
    pvVar10 = memorypool::traverse(pmVar4);
    if (pvVar10 == (void *)0x0) {
      pvVar10 = (void *)0x0;
      break;
    }
  } while (*(long *)((long)pvVar10 + 0x18) == 0);
  if (pvVar10 == (void *)0x0) {
    local_94 = 0;
  }
  else {
    local_94 = 0;
    do {
      iVar11 = 0;
      uVar16 = 0;
      uVar3 = local_94;
      do {
        lVar15 = *(long *)((long)pvVar10 + (long)sorgpivot[(int)uVar16] * 8);
        lVar8 = *(long *)((long)pvVar10 + (long)sdestpivot[(int)uVar16] * 8);
        uVar12 = *(ulong *)((long)pvVar10 + (long)((int)uVar16 >> 1) * 8);
        pvVar21 = (void *)(uVar12 & 0xfffffffffffffff8);
        pvVar19 = pvVar10;
        local_94 = uVar3;
        uVar17 = uVar16;
        if (pvVar10 != pvVar21 && pvVar21 != (void *)0x0) {
          while( true ) {
            if (*(long *)((long)pvVar21 + 0x18) == 0) {
              puts("  !! !! Wrong subface-subface connection (Dead subface).");
              lVar14 = (long)this->pointmarkindex;
              printf("    First: x%lx (%d, %d, %d).\n",pvVar19,
                     (ulong)*(uint *)(*(long *)((long)pvVar19 + (long)sorgpivot[(int)uVar17] * 8) +
                                     lVar14 * 4),
                     (ulong)*(uint *)(*(long *)((long)pvVar19 + (long)sdestpivot[(int)uVar17] * 8) +
                                     lVar14 * 4),
                     (ulong)*(uint *)(*(long *)((long)pvVar19 + (long)sapexpivot[(int)uVar17] * 8) +
                                     lVar14 * 4));
              printf("    Second: x%lx (DEAD)\n",pvVar21);
              local_94 = uVar3 + 1;
              goto LAB_0014a48e;
            }
            uVar20 = (uint)uVar12;
            uVar18 = uVar20 & 7;
            lVar14 = *(long *)((long)pvVar21 + (long)sorgpivot[uVar18] * 8);
            if (((lVar14 != lVar15) ||
                (*(long *)((long)pvVar21 + (long)sdestpivot[uVar18] * 8) != lVar8)) &&
               ((lVar14 != lVar8 ||
                (*(long *)((long)pvVar21 + (long)sdestpivot[uVar18] * 8) != lVar15)))) break;
            if (*(long *)((long)pvVar21 + (long)sapexpivot[uVar18] * 8) ==
                *(long *)((long)pvVar19 + (long)sapexpivot[(int)uVar17] * 8)) {
              __s = "  !! !! Existing two duplicated subfaces.";
              goto LAB_0014a393;
            }
            uVar17 = uVar20 & 7;
            uVar12 = *(ulong *)((long)pvVar21 + (ulong)(uVar20 & 6) * 4);
            pvVar22 = (void *)(uVar12 & 0xfffffffffffffff8);
            if ((pvVar22 == (void *)0x0) ||
               (pvVar19 = pvVar21, pvVar21 = pvVar22, pvVar10 == pvVar22)) goto LAB_0014a48e;
          }
          __s = "  !! !! Wrong subface-subface connection.";
LAB_0014a393:
          puts(__s);
          lVar14 = (long)this->pointmarkindex;
          printf("    First: x%lx (%d, %d, %d).\n",pvVar19,
                 (ulong)*(uint *)(*(long *)((long)pvVar19 + (long)sorgpivot[(int)uVar17] * 8) +
                                 lVar14 * 4),
                 (ulong)*(uint *)(*(long *)((long)pvVar19 + (long)sdestpivot[(int)uVar17] * 8) +
                                 lVar14 * 4),
                 (ulong)*(uint *)(*(long *)((long)pvVar19 + (long)sapexpivot[(int)uVar17] * 8) +
                                 lVar14 * 4));
          uVar12 = (ulong)(uVar18 << 2);
          lVar14 = (long)this->pointmarkindex;
          printf("    Scond: x%lx (%d, %d, %d).\n",pvVar21,
                 (ulong)*(uint *)(*(long *)((long)pvVar21 +
                                           (long)*(int *)((long)sorgpivot + uVar12) * 8) +
                                 lVar14 * 4),
                 (ulong)*(uint *)(*(long *)((long)pvVar21 +
                                           (long)*(int *)((long)sdestpivot + uVar12) * 8) +
                                 lVar14 * 4),
                 (ulong)*(uint *)(*(long *)((long)pvVar21 +
                                           (long)*(int *)((long)sapexpivot + uVar12) * 8) +
                                 lVar14 * 4));
          local_94 = uVar3 + 1;
        }
LAB_0014a48e:
        uVar12 = *(ulong *)((long)pvVar10 + (long)((int)uVar16 >> 1) * 8 + 0x30);
        uVar13 = uVar12 & 0xfffffffffffffff8;
        if (uVar13 != 0) {
          if (*(long *)(uVar13 + 0x18) == 0) {
            puts("  !! !! Wrong subface-subseg connection (Dead subseg).");
            lVar15 = (long)this->pointmarkindex;
            printf("    Sub: x%lx (%d, %d, %d).\n",pvVar10,
                   (ulong)*(uint *)(*(long *)((long)pvVar10 + (long)sorgpivot[(int)uVar16] * 8) +
                                   lVar15 * 4),
                   (ulong)*(uint *)(*(long *)((long)pvVar10 + (long)sdestpivot[(int)uVar16] * 8) +
                                   lVar15 * 4),
                   (ulong)*(uint *)(*(long *)((long)pvVar10 + (long)sapexpivot[(int)uVar16] * 8) +
                                   lVar15 * 4));
            printf("    Sub: x%lx (Dead)\n",uVar13);
          }
          else {
            uVar20 = (uint)uVar12 & 7;
            lVar14 = *(long *)(uVar13 + (long)sorgpivot[uVar20] * 8);
            if (((lVar14 == lVar15) && (*(long *)(uVar13 + (long)sdestpivot[uVar20] * 8) == lVar8))
               || ((lVar14 == lVar8 && (*(long *)(uVar13 + (long)sdestpivot[uVar20] * 8) == lVar15))
                  )) goto LAB_0014a627;
            puts("  !! !! Wrong subface-subseg connection.");
            lVar15 = (long)this->pointmarkindex;
            printf("    Sub: x%lx (%d, %d, %d).\n",pvVar10,
                   (ulong)*(uint *)(*(long *)((long)pvVar10 + (long)sorgpivot[(int)uVar16] * 8) +
                                   lVar15 * 4),
                   (ulong)*(uint *)(*(long *)((long)pvVar10 + (long)sdestpivot[(int)uVar16] * 8) +
                                   lVar15 * 4),
                   (ulong)*(uint *)(*(long *)((long)pvVar10 + (long)sapexpivot[(int)uVar16] * 8) +
                                   lVar15 * 4));
            printf("    Seg: x%lx (%d, %d).\n",uVar13,
                   (ulong)*(uint *)(*(long *)(uVar13 + (long)*(int *)((long)sorgpivot +
                                                                     (ulong)(uVar20 << 2)) * 8) +
                                   (long)this->pointmarkindex * 4),
                   (ulong)*(uint *)(*(long *)(uVar13 + (long)*(int *)((long)sdestpivot +
                                                                     (ulong)(uVar20 << 2)) * 8) +
                                   (long)this->pointmarkindex * 4));
          }
          local_94 = local_94 + 1;
        }
LAB_0014a627:
        if ((int)uVar3 < (int)local_94) break;
        uVar16 = snextpivot[(int)uVar16];
        iVar11 = iVar11 + 1;
        uVar3 = local_94;
      } while (iVar11 != 3);
      uVar12 = *(ulong *)((long)pvVar10 + (ulong)(uVar16 & 1) * 8 + 0x48);
      uVar13 = uVar12 & 0xfffffffffffffff0;
      if (uVar13 != 0) {
        uVar3 = stpivottbl[(uint)uVar12 & 0xf][(int)uVar16];
        if (*(long *)(uVar13 + 0x20) == 0) {
          puts("  !! !! Wrong sub-to-tet connection (Dead tet)");
          printf("    Sub: x%lx (%d, %d, %d).\n",pvVar10,
                 (ulong)*(uint *)(*(long *)((long)pvVar10 + (long)sorgpivot[(int)uVar16] * 8) +
                                 (long)this->pointmarkindex * 4));
          printf("    Tet: x%lx (DEAD)\n",uVar13);
          local_94 = local_94 + 1;
        }
        else {
          if ((*(long *)((long)pvVar10 + (long)sorgpivot[(int)uVar16] * 8) !=
               *(long *)(uVar13 + (long)orgpivot[(int)uVar3] * 8)) ||
             (*(long *)((long)pvVar10 + (long)sdestpivot[(int)uVar16] * 8) !=
              *(long *)(uVar13 + (long)destpivot[(int)uVar3] * 8))) {
            puts("  !! !! Wrong sub-to-tet connection");
            lVar15 = (long)this->pointmarkindex;
            printf("    Sub: x%lx (%d, %d, %d).\n",pvVar10,
                   (ulong)*(uint *)(*(long *)((long)pvVar10 + (long)sorgpivot[(int)uVar16] * 8) +
                                   lVar15 * 4),
                   (ulong)*(uint *)(*(long *)((long)pvVar10 + (long)sdestpivot[(int)uVar16] * 8) +
                                   lVar15 * 4),
                   (ulong)*(uint *)(*(long *)((long)pvVar10 + (long)sapexpivot[(int)uVar16] * 8) +
                                   lVar15 * 4));
            lVar15 = (long)this->pointmarkindex;
            printf("    Tet: x%lx (%d, %d, %d, %d).\n",uVar13,
                   (ulong)*(uint *)(*(long *)(uVar13 + (long)orgpivot[(int)uVar3] * 8) + lVar15 * 4)
                   ,(ulong)*(uint *)(*(long *)(uVar13 + (long)destpivot[(int)uVar3] * 8) +
                                    lVar15 * 4),
                   (ulong)*(uint *)(*(long *)(uVar13 + (long)apexpivot[(int)uVar3] * 8) + lVar15 * 4
                                   ),
                   (ulong)*(uint *)(*(long *)(uVar13 + (long)oppopivot[(int)uVar3] * 8) + lVar15 * 4
                                   ));
            local_94 = local_94 + 1;
          }
          if (*(long *)(uVar13 + 0x48) == 0) {
            uVar12 = 0;
          }
          else {
            uVar9 = *(ulong *)(*(long *)(uVar13 + 0x48) + (ulong)(uVar3 & 3) * 8);
            uVar12 = uVar9 & 0xfffffffffffffff8;
            uVar17 = tspivottbl[(int)uVar3][(uint)uVar9 & 7];
          }
          if ((*(long *)(uVar12 + (long)sorgpivot[(int)uVar17] * 8) !=
               *(long *)(uVar13 + (long)orgpivot[(int)uVar3] * 8)) ||
             (*(long *)(uVar12 + (long)sdestpivot[(int)uVar17] * 8) !=
              *(long *)(uVar13 + (long)destpivot[(int)uVar3] * 8))) {
            puts("  !! !! Wrong tet-sub connection.");
            lVar15 = (long)this->pointmarkindex;
            printf("    Sub: x%lx (%d, %d, %d).\n",uVar12,
                   (ulong)*(uint *)(*(long *)(uVar12 + (long)sorgpivot[(int)uVar17] * 8) +
                                   lVar15 * 4),
                   (ulong)*(uint *)(*(long *)(uVar12 + (long)sdestpivot[(int)uVar17] * 8) +
                                   lVar15 * 4),
                   (ulong)*(uint *)(*(long *)(uVar12 + (long)sapexpivot[(int)uVar17] * 8) +
                                   lVar15 * 4));
            lVar15 = (long)this->pointmarkindex;
            printf("    Tet: x%lx (%d, %d, %d, %d).\n",uVar13,
                   (ulong)*(uint *)(*(long *)(uVar13 + (long)orgpivot[(int)uVar3] * 8) + lVar15 * 4)
                   ,(ulong)*(uint *)(*(long *)(uVar13 + (long)destpivot[(int)uVar3] * 8) +
                                    lVar15 * 4),
                   (ulong)*(uint *)(*(long *)(uVar13 + (long)apexpivot[(int)uVar3] * 8) + lVar15 * 4
                                   ),
                   (ulong)*(uint *)(*(long *)(uVar13 + (long)oppopivot[(int)uVar3] * 8) + lVar15 * 4
                                   ));
            local_94 = local_94 + 1;
          }
          uVar12 = *(ulong *)(uVar13 + (ulong)(uVar3 & 3) * 8);
          uVar13 = uVar12 & 0xfffffffffffffff0;
          uVar3 = fsymtbl[(int)uVar3][(uint)uVar12 & 0xf];
          if (*(long *)(uVar13 + 0x48) == 0) {
            uVar12 = 0;
          }
          else {
            uVar9 = *(ulong *)(*(long *)(uVar13 + 0x48) + (ulong)(uVar3 & 3) * 8);
            uVar12 = uVar9 & 0xfffffffffffffff8;
            uVar17 = tspivottbl[(int)uVar3][(uint)uVar9 & 7];
          }
          if (uVar12 == 0) {
            puts("  Warning: Broken tet-sub-tet connection.");
          }
          else if ((*(long *)(uVar12 + (long)sorgpivot[(int)uVar17] * 8) !=
                    *(long *)(uVar13 + (long)orgpivot[(int)uVar3] * 8)) ||
                  (*(long *)(uVar12 + (long)sdestpivot[(int)uVar17] * 8) !=
                   *(long *)(uVar13 + (long)destpivot[(int)uVar3] * 8))) {
            puts("  !! !! Wrong tet-sub connection.");
            lVar15 = (long)this->pointmarkindex;
            printf("    Sub: x%lx (%d, %d, %d).\n",uVar12,
                   (ulong)*(uint *)(*(long *)(uVar12 + (long)sorgpivot[(int)uVar17] * 8) +
                                   lVar15 * 4),
                   (ulong)*(uint *)(*(long *)(uVar12 + (long)sdestpivot[(int)uVar17] * 8) +
                                   lVar15 * 4),
                   (ulong)*(uint *)(*(long *)(uVar12 + (long)sapexpivot[(int)uVar17] * 8) +
                                   lVar15 * 4));
            lVar15 = (long)this->pointmarkindex;
            printf("    Tet: x%lx (%d, %d, %d, %d).\n",uVar13,
                   (ulong)*(uint *)(*(long *)(uVar13 + (long)orgpivot[(int)uVar3] * 8) + lVar15 * 4)
                   ,(ulong)*(uint *)(*(long *)(uVar13 + (long)destpivot[(int)uVar3] * 8) +
                                    lVar15 * 4),
                   (ulong)*(uint *)(*(long *)(uVar13 + (long)apexpivot[(int)uVar3] * 8) + lVar15 * 4
                                   ),
                   (ulong)*(uint *)(*(long *)(uVar13 + (long)oppopivot[(int)uVar3] * 8) + lVar15 * 4
                                   ));
            local_94 = local_94 + 1;
          }
        }
      }
      if ((*(byte *)((long)pvVar10 + (long)this->shmarkindex * 4 + 4) & 1) != 0) {
        printf("  !! A infected subface: (%d, %d, %d).\n",
               (ulong)*(uint *)(*(long *)((long)pvVar10 + (long)sorgpivot[(int)uVar16] * 8) +
                               (long)this->pointmarkindex * 4),
               (ulong)*(uint *)(*(long *)((long)pvVar10 + (long)sdestpivot[(int)uVar16] * 8) +
                               (long)this->pointmarkindex * 4));
      }
      if ((*(byte *)((long)pvVar10 + (long)this->shmarkindex * 4 + 4) & 2) != 0) {
        printf("  !! A marked subface: (%d, %d, %d).\n",
               (ulong)*(uint *)(*(long *)((long)pvVar10 + (long)sorgpivot[(int)uVar16] * 8) +
                               (long)this->pointmarkindex * 4),
               (ulong)*(uint *)(*(long *)((long)pvVar10 + (long)sdestpivot[(int)uVar16] * 8) +
                               (long)this->pointmarkindex * 4));
      }
      pmVar4 = this->subfaces;
      do {
        pvVar10 = memorypool::traverse(pmVar4);
        if (pvVar10 == (void *)0x0) {
          pvVar10 = (void *)0x0;
          break;
        }
      } while (*(long *)((long)pvVar10 + 0x18) == 0);
    } while (pvVar10 != (void *)0x0);
  }
  if (local_94 == 0) {
    if (this->b->quiet == 0) {
      puts("  Mesh boundaries connected correctly.");
    }
  }
  else {
    printf("  !! !! !! !! %d boundary connection viewed with horror.\n",(ulong)local_94);
  }
  pmVar4 = this->subfaces;
  pmVar4->pathblock = ppvVar6;
  pmVar4->pathitem = pvVar7;
  pmVar4->pathitemsleft = iVar1;
  pmVar4->alignbytes = iVar2;
  return local_94;
}

Assistant:

int tetgenmesh::checkshells()
{
  triface neightet, symtet;
  face shloop, spinsh, nextsh;
  face checkseg;
  point pa, pb;
  int bakcount;
  int horrors, i;

  if (!b->quiet) {
    printf("  Checking consistency of the mesh boundary...\n");
  }
  horrors = 0;

  void **bakpathblock = subfaces->pathblock;
  void *bakpathitem = subfaces->pathitem;
  int bakpathitemsleft = subfaces->pathitemsleft;
  int bakalignbytes = subfaces->alignbytes;

  subfaces->traversalinit();
  shloop.sh = shellfacetraverse(subfaces);
  while (shloop.sh != NULL) {
    shloop.shver = 0;
    for (i = 0; i < 3; i++) {
      // Check the face ring at this edge.
      pa = sorg(shloop);
      pb = sdest(shloop);
      spinsh = shloop;
      spivot(spinsh, nextsh);
      bakcount = horrors;
      while ((nextsh.sh != NULL) && (nextsh.sh != shloop.sh)) {
        if (nextsh.sh[3] == NULL) {
          printf("  !! !! Wrong subface-subface connection (Dead subface).\n");
          printf("    First: x%lx (%d, %d, %d).\n", (uintptr_t) spinsh.sh,
                 pointmark(sorg(spinsh)), pointmark(sdest(spinsh)), 
                 pointmark(sapex(spinsh)));
          printf("    Second: x%lx (DEAD)\n", (uintptr_t) nextsh.sh);
          horrors++;
          break;
        }
        // check if they have the same edge.
        if (!(((sorg(nextsh) == pa) && (sdest(nextsh) == pb)) ||
              ((sorg(nextsh) == pb) && (sdest(nextsh) == pa)))) {
           printf("  !! !! Wrong subface-subface connection.\n");
           printf("    First: x%lx (%d, %d, %d).\n", (uintptr_t) spinsh.sh,
                  pointmark(sorg(spinsh)), pointmark(sdest(spinsh)), 
                  pointmark(sapex(spinsh)));
           printf("    Scond: x%lx (%d, %d, %d).\n", (uintptr_t) nextsh.sh,
                  pointmark(sorg(nextsh)), pointmark(sdest(nextsh)), 
                  pointmark(sapex(nextsh)));
           horrors++;
           break;
        }
        // Check they should not have the same apex.
        if (sapex(nextsh) == sapex(spinsh)) {
           printf("  !! !! Existing two duplicated subfaces.\n");
           printf("    First: x%lx (%d, %d, %d).\n", (uintptr_t) spinsh.sh,
                  pointmark(sorg(spinsh)), pointmark(sdest(spinsh)), 
                  pointmark(sapex(spinsh)));
           printf("    Scond: x%lx (%d, %d, %d).\n", (uintptr_t) nextsh.sh,
                  pointmark(sorg(nextsh)), pointmark(sdest(nextsh)), 
                  pointmark(sapex(nextsh)));
           horrors++;
           break;
        }
        spinsh = nextsh;
        spivot(spinsh, nextsh);
      }
      // Check subface-subseg bond.
      sspivot(shloop, checkseg);
      if (checkseg.sh != NULL) {
        if (checkseg.sh[3] == NULL) {
          printf("  !! !! Wrong subface-subseg connection (Dead subseg).\n");
          printf("    Sub: x%lx (%d, %d, %d).\n", (uintptr_t) shloop.sh,
                 pointmark(sorg(shloop)), pointmark(sdest(shloop)), 
                 pointmark(sapex(shloop)));
          printf("    Sub: x%lx (Dead)\n", (uintptr_t) checkseg.sh);
          horrors++;
        } else {
          if (!(((sorg(checkseg) == pa) && (sdest(checkseg) == pb)) ||
                ((sorg(checkseg) == pb) && (sdest(checkseg) == pa)))) {
            printf("  !! !! Wrong subface-subseg connection.\n");
            printf("    Sub: x%lx (%d, %d, %d).\n", (uintptr_t) shloop.sh,
                   pointmark(sorg(shloop)), pointmark(sdest(shloop)), 
                   pointmark(sapex(shloop)));
            printf("    Seg: x%lx (%d, %d).\n", (uintptr_t) checkseg.sh,
                   pointmark(sorg(checkseg)), pointmark(sdest(checkseg)));
            horrors++;
          }
        }
      }
      if (horrors > bakcount) break; // An error detected. 
      senextself(shloop);
    }
    // Check tet-subface connection.
    stpivot(shloop, neightet);
    if (neightet.tet != NULL) {
      if (neightet.tet[4] == NULL) {
        printf("  !! !! Wrong sub-to-tet connection (Dead tet)\n");
        printf("    Sub: x%lx (%d, %d, %d).\n", (uintptr_t) shloop.sh,
               pointmark(sorg(shloop)), pointmark(sdest(shloop)), 
               pointmark(sapex(shloop)));
        printf("    Tet: x%lx (DEAD)\n", (uintptr_t) neightet.tet);
        horrors++;
      } else {
        if (!((sorg(shloop) == org(neightet)) && 
              (sdest(shloop) == dest(neightet)))) {
          printf("  !! !! Wrong sub-to-tet connection\n");
          printf("    Sub: x%lx (%d, %d, %d).\n", (uintptr_t) shloop.sh,
                 pointmark(sorg(shloop)), pointmark(sdest(shloop)), 
                 pointmark(sapex(shloop)));
          printf("    Tet: x%lx (%d, %d, %d, %d).\n",
                 (uintptr_t) neightet.tet, pointmark(org(neightet)), 
                 pointmark(dest(neightet)), pointmark(apex(neightet)),
                 pointmark(oppo(neightet)));
          horrors++;
        }
        tspivot(neightet, spinsh);
        if (!((sorg(spinsh) == org(neightet)) && 
              (sdest(spinsh) == dest(neightet)))) {
          printf("  !! !! Wrong tet-sub connection.\n");
          printf("    Sub: x%lx (%d, %d, %d).\n", (uintptr_t) spinsh.sh,
                 pointmark(sorg(spinsh)), pointmark(sdest(spinsh)), 
                 pointmark(sapex(spinsh)));
          printf("    Tet: x%lx (%d, %d, %d, %d).\n", 
                 (uintptr_t) neightet.tet, pointmark(org(neightet)), 
                 pointmark(dest(neightet)), pointmark(apex(neightet)), 
                 pointmark(oppo(neightet)));
          horrors++;
        }
        fsym(neightet, symtet);
        tspivot(symtet, spinsh);
        if (spinsh.sh != NULL) {
          if (!((sorg(spinsh) == org(symtet)) && 
                (sdest(spinsh) == dest(symtet)))) {
            printf("  !! !! Wrong tet-sub connection.\n");
            printf("    Sub: x%lx (%d, %d, %d).\n", (uintptr_t) spinsh.sh,
                   pointmark(sorg(spinsh)), pointmark(sdest(spinsh)), 
                   pointmark(sapex(spinsh)));
            printf("    Tet: x%lx (%d, %d, %d, %d).\n", 
                   (uintptr_t) symtet.tet, pointmark(org(symtet)), 
                   pointmark(dest(symtet)), pointmark(apex(symtet)), 
                   pointmark(oppo(symtet)));
            horrors++;
          }
        } else {
          printf("  Warning: Broken tet-sub-tet connection.\n");
        }
      }
    }
    if (sinfected(shloop)) {
      // This may be a bug. report it.
      printf("  !! A infected subface: (%d, %d, %d).\n", 
             pointmark(sorg(shloop)), pointmark(sdest(shloop)), 
             pointmark(sapex(shloop)));
    }
    if (smarktested(shloop)) {
      // This may be a bug. report it.
      printf("  !! A marked subface: (%d, %d, %d).\n", pointmark(sorg(shloop)), 
             pointmark(sdest(shloop)), pointmark(sapex(shloop)));
    }
    shloop.sh = shellfacetraverse(subfaces);
  }

  if (horrors == 0) {
    if (!b->quiet) {
      printf("  Mesh boundaries connected correctly.\n");
    }
  } else {
    printf("  !! !! !! !! %d boundary connection viewed with horror.\n",
           horrors);
  }

  subfaces->pathblock = bakpathblock;
  subfaces->pathitem = bakpathitem;
  subfaces->pathitemsleft = bakpathitemsleft;
  subfaces->alignbytes = bakalignbytes;

  return horrors;
}